

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsCommon.cpp
# Opt level: O3

void Scs::InitializeInternal(InitParams *params)

{
  _func_void_ptr_void_ptr_unsigned_long *local_10;
  
  std::function<void_(const_char_*)>::operator=(&s_params.logFn,&params->logFn);
  std::function<void_*(unsigned_long)>::operator=(&s_params.allocFn,&params->allocFn);
  std::function<void_*(void_*,_unsigned_long)>::operator=(&s_params.reallocFn,&params->reallocFn);
  std::function<void_(void_*)>::operator=(&s_params.freeFn,&params->freeFn);
  if (s_params.logFn.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_10 = DefaultWriteLine;
    std::function<void(char_const*)>::operator=
              ((function<void(char_const*)> *)&s_params,(_func_void_char_ptr **)&local_10);
  }
  if (s_params.allocFn.super__Function_base._M_manager == (_Manager_type)0x0) {
    if (s_params.reallocFn.super__Function_base._M_manager == (_Manager_type)0x0 &&
        s_params.freeFn.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_10 = DefaultAlloc;
      std::function<void*(unsigned_long)>::operator=
                ((function<void*(unsigned_long)> *)&s_params.allocFn,
                 (_func_void_ptr_unsigned_long **)&local_10);
      local_10 = DefaultRealloc;
      std::function<void*(void*,unsigned_long)>::operator=
                ((function<void*(void*,unsigned_long)> *)&s_params.reallocFn,&local_10);
      local_10 = DefaultFree;
      std::function<void(void*)>::operator=
                ((function<void(void*)> *)&s_params.freeFn,(_func_void_void_ptr **)&local_10);
      return;
    }
  }
  else if ((s_params.reallocFn.super__Function_base._M_manager != (_Manager_type)0x0) &&
          (s_params.freeFn.super__Function_base._M_manager != (_Manager_type)0x0)) {
    return;
  }
  __assert_fail("!s_params.allocFn && !s_params.reallocFn && !s_params.freeFn",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsCommon.cpp"
                ,0x47,"void Scs::InitializeInternal(const InitParams &)");
}

Assistant:

void Scs::InitializeInternal(const InitParams & params)
{
	s_params = params;
	if (!s_params.logFn)
		s_params.logFn = &DefaultWriteLine;
	if (!s_params.allocFn || !s_params.reallocFn || !s_params.freeFn)
	{
		// You must define all memory functions or none
		assert(!s_params.allocFn && !s_params.reallocFn && !s_params.freeFn);
		s_params.allocFn = &DefaultAlloc;
		s_params.reallocFn = &DefaultRealloc;
		s_params.freeFn = &DefaultFree;
	}
}